

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetColumnOffset(int column_index,float offset)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  uint uVar4;
  float fVar5;
  float fVar6;
  
  while( true ) {
    pIVar3 = GImGui;
    pIVar1 = GImGui->CurrentWindow;
    pIVar1->Accessed = true;
    if (column_index < 0) {
      column_index = (pIVar1->DC).ColumnsCurrent;
    }
    if ((pIVar1->DC).ColumnsData.Size <= column_index) {
      __assert_fail("column_index < window->DC.ColumnsData.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                    ,0x277b,"void ImGui::SetColumnOffset(int, float)");
    }
    if (((pIVar1->DC).ColumnsFlags & 4) == 0) {
      bVar2 = column_index < (pIVar1->DC).ColumnsCount + -1;
    }
    else {
      bVar2 = false;
    }
    fVar5 = 0.0;
    if (bVar2) {
      fVar5 = GetColumnWidth(column_index);
    }
    if ((((pIVar1->DC).ColumnsFlags & 8) == 0) &&
       (fVar6 = (pIVar1->DC).ColumnsMaxX -
                (float)((pIVar1->DC).ColumnsCount - column_index) *
                (pIVar3->Style).ColumnsMinSpacing, fVar6 <= offset)) {
      offset = fVar6;
    }
    fVar6 = (pIVar1->DC).ColumnsMinX;
    fVar6 = (offset - fVar6) / ((pIVar1->DC).ColumnsMaxX - fVar6);
    ImGuiStorage::SetFloat((pIVar1->DC).StateStorage,(pIVar1->DC).ColumnsSetId + column_index,fVar6)
    ;
    if ((pIVar1->DC).ColumnsData.Size <= column_index) break;
    (pIVar1->DC).ColumnsData.Data[column_index].OffsetNorm = fVar6;
    if (!bVar2) {
      return;
    }
    column_index = column_index + 1;
    fVar6 = (pIVar3->Style).ColumnsMinSpacing;
    uVar4 = -(uint)(fVar5 <= fVar6);
    offset = offset + (float)(~uVar4 & (uint)fVar5 | (uint)fVar6 & uVar4);
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                ,0x38b,
                "value_type &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    IM_ASSERT(column_index < window->DC.ColumnsData.Size);

    const bool preserve_width = !(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoPreserveWidths) && (column_index < window->DC.ColumnsCount-1);
    const float width = preserve_width ? GetColumnWidth(column_index) : 0.0f;

    if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoForceWithinWindow))
        offset = ImMin(offset, window->DC.ColumnsMaxX - g.Style.ColumnsMinSpacing * (window->DC.ColumnsCount - column_index));
    const float offset_norm = PixelsToOffsetNorm(window, offset);

    const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
    window->DC.StateStorage->SetFloat(column_id, offset_norm);
    window->DC.ColumnsData[column_index].OffsetNorm = offset_norm;

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}